

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O1

void newbltchar(LispPTR *args)

{
  DLword *ybase;
  DLword DVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  DLword *pDVar5;
  ulong uVar6;
  uint *puVar7;
  sbyte sVar8;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ushort uVar17;
  uint uVar18;
  uint *puVar19;
  int iVar20;
  uint uVar21;
  ushort uVar22;
  uint uVar23;
  uint uVar24;
  UNSIGNED x;
  uint *puVar25;
  uint *puVar26;
  uint uVar27;
  ulong uVar28;
  uint *puVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  uint local_80;
  uint local_74;
  uint local_64;
  uint local_54;
  uint local_50;
  sbyte sVar9;
  
  uVar14 = (ulong)args[2];
  if ((args[2] & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar14);
  }
  pDVar5 = Lisp_world;
  if (((ushort)((ushort)*args >> 8) == Lisp_world[uVar14 + 0x3e]) &&
     (*(int *)(Lisp_world + uVar14 + 0xe) == 0)) {
    uVar15 = *(uint *)(Lisp_world + uVar14);
    if ((uVar15 & 0xfff0000) == 0xf0000) {
      uVar15 = uVar15 | 0xffff0000;
    }
    else {
      if ((uVar15 & 0xfff0000) != 0xe0000) goto LAB_0011040f;
      uVar15 = uVar15 & 0xffff;
    }
    uVar11 = *(uint *)(Lisp_world + uVar14 + 0x18);
    if ((uVar11 & 0xfff0000) == 0xf0000) {
      uVar11 = uVar11 | 0xffff0000;
    }
    else {
      if ((uVar11 & 0xfff0000) != 0xe0000) goto LAB_0011040f;
      uVar11 = uVar11 & 0xffff;
    }
    uVar18 = *(uint *)(Lisp_world + uVar14 + 0x1a);
    if ((uVar18 & 0xfff0000) == 0xf0000) {
      uVar18 = uVar18 | 0xffff0000;
    }
    else {
      if ((uVar18 & 0xfff0000) != 0xe0000) goto LAB_0011040f;
      uVar18 = uVar18 & 0xffff;
    }
    uVar13 = *(uint *)(Lisp_world + uVar14 + 4);
    if ((uVar13 & 0xfff0000) == 0xf0000) {
      uVar13 = uVar13 | 0xffff0000;
    }
    else {
      if ((uVar13 & 0xfff0000) != 0xe0000) goto LAB_0011040f;
      uVar13 = uVar13 & 0xffff;
    }
    uVar30 = (uint)(byte)(ushort)*args;
    iVar20 = *(ushort *)((ulong)(Lisp_world + (*(int *)(Lisp_world + uVar14 + 0x30) + uVar30)) ^ 2)
             + uVar15;
    if ((((int)uVar15 <= (int)uVar18) || (iVar20 <= (int)uVar11)) && (args[1] == *TOPWDS68k)) {
      uVar11 = *(ushort *)
                ((ulong)(Lisp_world + (uVar30 + *(int *)(Lisp_world + uVar14 + 0x10))) ^ 2) + uVar15
      ;
      uVar18 = uVar15 + 0xe0000 +
               (uint)*(ushort *)
                      ((ulong)(Lisp_world + (uVar30 + *(int *)(Lisp_world + uVar14 + 0x10))) ^ 2);
      if (0xffff < uVar11) {
        uVar18 = uVar11 & 0xffff | 0xf0000;
      }
      *(uint *)(Lisp_world + uVar14) = uVar18;
      uVar15 = uVar15 + uVar13;
      uVar13 = iVar20 + uVar13;
      if ((int)(uint)pDVar5[uVar14 + 0x22] <= (int)uVar13) {
        uVar13 = (uint)pDVar5[uVar14 + 0x22];
      }
      x = (UNSIGNED)pDVar5[uVar14 + 0x23];
      if ((int)(uint)pDVar5[uVar14 + 0x23] < (int)uVar15) {
        x = (UNSIGNED)uVar15;
      }
      uVar28 = (ulong)*(uint *)(pDVar5 + uVar14 + 0x2a);
      uVar11 = (uint)x;
      if ((*(uint *)(pDVar5 + uVar14 + 0x2a) & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar28);
      }
      uVar18 = (uint)Lisp_world[uVar28 + 8];
      if (uVar18 == 0) {
        return;
      }
      iVar20 = uVar13 - uVar11;
      if (iVar20 < 1) {
        return;
      }
      ybase = Lisp_world +
              ((ulong)Lisp_world[uVar28 + 1] | (ulong)(uint)(*(int *)(Lisp_world + uVar28) << 0x10))
      ;
      DVar1 = Lisp_world[uVar28 + 6];
      uVar17 = -DVar1;
      if (0 < (short)DVar1) {
        uVar17 = DVar1;
      }
      DVar1 = Lisp_world[uVar28 + 2];
      uVar22 = -DVar1;
      if (0 < (short)DVar1) {
        uVar22 = DVar1;
      }
      uVar2 = Lisp_world[uVar28 + 0xb];
      uVar6 = (x >> 3) + (long)ybase;
      uVar13 = (uVar11 & 7) + ((uint)uVar6 & 3) * 8;
      uVar30 = (iVar20 + uVar13) - 1 & 0x1f;
      local_74 = -1 << (~(byte)uVar30 & 0x1f);
      uVar15 = (uVar11 - uVar15) +
               (uint)*(ushort *)
                      ((ulong)(Lisp_world + ((uint)(byte)*args + *(int *)(pDVar5 + uVar14 + 0x12)))
                      ^ 2);
      ScreenLocked = 1;
      if ((int)uVar15 < 0) {
        uVar14 = -(ulong)(7 - uVar15 >> 3);
      }
      else {
        uVar14 = (ulong)(uVar15 >> 3);
      }
      uVar14 = (long)Lisp_world +
               uVar14 + ((ulong)Lisp_world[uVar28 + 5] |
                        (ulong)(uint)(*(int *)(Lisp_world + uVar28 + 4) << 0x10)) * 2;
      if (uVar18 != 0) {
        local_50 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
        uVar10 = uVar2 >> 9 & 3;
        puVar7 = (uint *)(uVar6 & 0xfffffffffffffffc);
        local_54 = local_74 & local_50;
        iVar31 = (uVar13 + iVar20 >> 5) - 1;
        puVar19 = (uint *)(uVar14 & 0xfffffffffffffffc);
        uVar15 = (uVar15 & 7) + ((uint)uVar14 & 3) * 8;
        local_64 = iVar20 + uVar15 + 0x1f & 0x1f;
        uVar21 = uVar15 - uVar13 & 0x1f;
        uVar16 = uVar13 - uVar15 & 0x1f;
        uVar32 = 0;
        local_80 = -(uint)(uVar21 == 0) | ~(-1 << (sbyte)uVar21);
        uVar27 = -(uVar2 >> 0xb & 1);
        uVar11 = uVar18;
        do {
          uVar24 = *puVar19;
          sVar8 = (sbyte)uVar16;
          sVar9 = (sbyte)uVar21;
          if ((uVar13 < uVar15) && (0x20 < (int)(uVar15 + iVar20))) {
            puVar29 = puVar19 + 2;
            uVar23 = puVar19[1] >> sVar8 & local_80 | uVar24 << sVar9;
            uVar32 = ~local_80 & puVar19[1] << sVar9;
          }
          else {
            puVar29 = puVar19 + 1;
            if (uVar13 < uVar15) {
              uVar23 = uVar24 << sVar9;
            }
            else {
              uVar23 = uVar24 >> sVar8 & local_80;
              uVar32 = ~local_80 & uVar24 << sVar9;
            }
          }
          uVar23 = uVar23 ^ uVar27;
          puVar26 = puVar7;
          uVar24 = local_54;
          if ((int)(uVar13 + iVar20) < 0x21) {
LAB_00110cd1:
            uVar3 = *puVar26;
            switch(uVar10) {
            case 1:
              uVar23 = uVar23 & uVar3;
              break;
            case 2:
              uVar23 = uVar23 | uVar3;
              break;
            case 3:
              uVar23 = uVar23 ^ uVar3;
            }
            *puVar26 = uVar3 & ~uVar24 | uVar23 & uVar24;
          }
          else {
            uVar24 = *puVar7;
            switch(uVar10) {
            case 1:
              uVar23 = uVar23 & uVar24;
              break;
            case 2:
              uVar23 = uVar23 | uVar24;
              break;
            case 3:
              uVar23 = uVar23 ^ uVar24;
            }
            *puVar7 = uVar23 & local_50 | uVar24 & ~local_50;
            puVar26 = puVar7 + 1;
            if (uVar15 == uVar13) {
              if ((uVar2 >> 0xb & 1) == 0) {
                switch(uVar10) {
                case 0:
                  if (0 < iVar31) {
                    iVar12 = iVar31 + 1;
                    do {
                      uVar24 = *puVar29;
                      puVar29 = puVar29 + 1;
                      *puVar26 = uVar24;
                      puVar26 = puVar26 + 1;
                      iVar12 = iVar12 + -1;
                    } while (1 < iVar12);
                  }
                  break;
                case 1:
                  if (0 < iVar31) {
                    iVar12 = iVar31 + 1;
                    do {
                      *puVar26 = *puVar26 & *puVar29;
                      puVar29 = puVar29 + 1;
                      puVar26 = puVar26 + 1;
                      iVar12 = iVar12 + -1;
                    } while (1 < iVar12);
                  }
                  break;
                case 2:
                  if (0 < iVar31) {
                    iVar12 = iVar31 + 1;
                    do {
                      *puVar26 = *puVar26 | *puVar29;
                      puVar29 = puVar29 + 1;
                      puVar26 = puVar26 + 1;
                      iVar12 = iVar12 + -1;
                    } while (1 < iVar12);
                  }
                  break;
                case 3:
                  if (0 < iVar31) {
                    iVar12 = iVar31 + 1;
                    do {
                      *puVar26 = *puVar26 ^ *puVar29;
                      puVar29 = puVar29 + 1;
                      puVar26 = puVar26 + 1;
                      iVar12 = iVar12 + -1;
                    } while (1 < iVar12);
                  }
                }
              }
              else {
                switch(uVar10) {
                case 0:
                  if (0 < iVar31) {
                    iVar12 = iVar31 + 1;
                    do {
                      uVar24 = *puVar29;
                      puVar29 = puVar29 + 1;
                      *puVar26 = ~uVar24;
                      puVar26 = puVar26 + 1;
                      iVar12 = iVar12 + -1;
                    } while (1 < iVar12);
                  }
                  break;
                case 1:
                  if (0 < iVar31) {
                    iVar12 = iVar31 + 1;
                    do {
                      *puVar26 = *puVar26 & ~*puVar29;
                      puVar29 = puVar29 + 1;
                      puVar26 = puVar26 + 1;
                      iVar12 = iVar12 + -1;
                    } while (1 < iVar12);
                  }
                  break;
                case 2:
                  if (0 < iVar31) {
                    iVar12 = iVar31 + 1;
                    do {
                      *puVar26 = *puVar26 | ~*puVar29;
                      puVar29 = puVar29 + 1;
                      puVar26 = puVar26 + 1;
                      iVar12 = iVar12 + -1;
                    } while (1 < iVar12);
                  }
                  break;
                case 3:
                  if (0 < iVar31) {
                    iVar12 = iVar31 + 1;
                    do {
                      uVar24 = *puVar29;
                      puVar29 = puVar29 + 1;
                      *puVar26 = ~(uVar24 ^ *puVar26);
                      puVar26 = puVar26 + 1;
                      iVar12 = iVar12 + -1;
                    } while (1 < iVar12);
                  }
                }
              }
            }
            else if ((uVar2 >> 0xb & 1) == 0) {
              switch(uVar10) {
              case 0:
                if (0 < iVar31) {
                  iVar12 = iVar31 + 1;
                  do {
                    uVar24 = *puVar29;
                    puVar29 = puVar29 + 1;
                    uVar23 = uVar24 >> sVar8 | uVar32;
                    uVar32 = uVar24 << sVar9;
                    *puVar26 = uVar23;
                    puVar26 = puVar26 + 1;
                    iVar12 = iVar12 + -1;
                  } while (1 < iVar12);
                }
                break;
              case 1:
                if (0 < iVar31) {
                  iVar12 = iVar31 + 1;
                  uVar24 = uVar32;
                  do {
                    uVar23 = *puVar29;
                    puVar29 = puVar29 + 1;
                    uVar32 = uVar23 << sVar9;
                    *puVar26 = *puVar26 & (uVar23 >> sVar8 | uVar24);
                    puVar26 = puVar26 + 1;
                    iVar12 = iVar12 + -1;
                    uVar24 = uVar32;
                  } while (1 < iVar12);
                }
                break;
              case 2:
                if (0 < iVar31) {
                  iVar12 = iVar31 + 1;
                  puVar25 = puVar26;
                  uVar24 = uVar32;
                  do {
                    uVar23 = *puVar29;
                    puVar29 = puVar29 + 1;
                    uVar32 = uVar23 << sVar9;
                    puVar26 = puVar25 + 1;
                    *puVar25 = uVar24 | *puVar25 | uVar23 >> sVar8;
                    iVar12 = iVar12 + -1;
                    puVar25 = puVar26;
                    uVar24 = uVar32;
                  } while (1 < iVar12);
                }
                break;
              case 3:
                if (0 < iVar31) {
                  iVar12 = iVar31 + 1;
                  uVar24 = uVar32;
                  do {
                    uVar23 = *puVar29;
                    puVar29 = puVar29 + 1;
                    uVar32 = uVar23 << sVar9;
                    *puVar26 = *puVar26 ^ (uVar23 >> sVar8 | uVar24);
                    puVar26 = puVar26 + 1;
                    iVar12 = iVar12 + -1;
                    uVar24 = uVar32;
                  } while (1 < iVar12);
                }
              }
            }
            else {
              switch(uVar10) {
              case 0:
                if (0 < iVar31) {
                  iVar12 = iVar31 + 1;
                  do {
                    uVar24 = *puVar29;
                    puVar29 = puVar29 + 1;
                    uVar23 = uVar24 >> sVar8 | uVar32;
                    uVar32 = uVar24 << sVar9;
                    *puVar26 = ~uVar23;
                    puVar26 = puVar26 + 1;
                    iVar12 = iVar12 + -1;
                  } while (1 < iVar12);
                }
                break;
              case 1:
                if (0 < iVar31) {
                  iVar12 = iVar31 + 1;
                  do {
                    uVar24 = *puVar29;
                    puVar29 = puVar29 + 1;
                    uVar23 = uVar24 >> sVar8 | uVar32;
                    uVar32 = uVar24 << sVar9;
                    *puVar26 = *puVar26 & ~uVar23;
                    puVar26 = puVar26 + 1;
                    iVar12 = iVar12 + -1;
                  } while (1 < iVar12);
                }
                break;
              case 2:
                if (0 < iVar31) {
                  iVar12 = iVar31 + 1;
                  do {
                    uVar24 = *puVar29;
                    puVar29 = puVar29 + 1;
                    uVar23 = uVar24 >> sVar8 | uVar32;
                    uVar32 = uVar24 << sVar9;
                    *puVar26 = *puVar26 | ~uVar23;
                    puVar26 = puVar26 + 1;
                    iVar12 = iVar12 + -1;
                  } while (1 < iVar12);
                }
                break;
              case 3:
                if (0 < iVar31) {
                  iVar12 = iVar31 + 1;
                  puVar25 = puVar26;
                  do {
                    uVar24 = *puVar29;
                    puVar29 = puVar29 + 1;
                    uVar23 = uVar24 >> sVar8 | uVar32;
                    uVar32 = uVar24 << sVar9;
                    puVar26 = puVar25 + 1;
                    *puVar25 = ~(uVar23 ^ *puVar25);
                    iVar12 = iVar12 + -1;
                    puVar25 = puVar26;
                  } while (1 < iVar12);
                }
              }
            }
            if (uVar30 != 0x1f) {
              uVar23 = uVar32;
              if (local_64 <= uVar30) {
                uVar23 = *puVar29 >> sVar8 & local_80 | uVar32;
              }
              uVar23 = uVar23 ^ uVar27;
              uVar24 = local_74;
              goto LAB_00110cd1;
            }
          }
          uVar24 = (uint)uVar22;
          if (((uVar22 | uVar17) & 0x1f) != 0) {
            uVar24 = uVar13 + uVar22;
            uVar13 = uVar24 & 0x1f;
            uVar30 = (uVar13 + iVar20) - 1 & 0x1f;
            local_50 = -(uint)(uVar13 == 0) | ~(-1 << (-(char)uVar13 & 0x1fU));
            local_74 = -1 << (~(byte)uVar30 & 0x1f);
            local_54 = local_74 & local_50;
            iVar31 = (uVar13 + iVar20 >> 5) - 1;
          }
          uVar23 = (uint)uVar17;
          if (((uVar22 | uVar17) & 0x1f) != 0) {
            uVar23 = uVar15 + uVar17;
            uVar15 = uVar23 & 0x1f;
            local_64 = iVar20 + 0x1f + uVar23 & 0x1f;
            uVar21 = uVar23 - uVar13 & 0x1f;
            uVar16 = uVar13 - uVar23 & 0x1f;
            local_80 = -(uint)(uVar21 == 0) | ~(-1 << (sbyte)uVar21);
          }
          puVar7 = puVar7 + (uVar24 >> 5);
          puVar19 = puVar19 + (uVar23 >> 5);
          bVar4 = 1 < (int)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar4);
      }
      if ((DisplayRegion68k <= ybase) && (ybase <= DISP_MAX_Address)) {
        flush_display_lineregion(x,ybase,iVar20,uVar18);
      }
      ScreenLocked = 0;
      return;
    }
  }
LAB_0011040f:
  if ((BLTCHAR_index == 0) &&
     (BLTCHAR_index = get_package_atom("\\MAIKO.PUNTBLTCHAR",0x12,"INTERLISP",9,0),
     BLTCHAR_index == 0xffffffff)) {
    return;
  }
  MachineState.csp = MachineState.csp + 4;
  ccfuncall(BLTCHAR_index,3,3);
  return;
}

Assistant:

void newbltchar(LispPTR *args) {
  DISPLAYDATA *displaydata68k;
  int right, left, curx;
  PILOTBBT *pbt;
  int lmargin, rmargin, xoff;
  int base;
  int h, w;
#ifdef REALCURSOR
  int displayflg;
#endif
  int backwardflg = 0, sx, dx, srcbpl, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0;
#ifdef NEWBITBLT
  int num_gray = 0, curr_gray_line = 0;
#endif

  displaydata68k = (DISPLAYDATA *)NativeAligned4FromLAddr(((BLTARG *)args)->displaydata);

  if ((displaydata68k->ddcharset & 0xFFFF) != ((BLTARG *)args)->charset) {
    /*if(changecharset_display(displaydata68k, ((BLTARG *)args)->charset) ==-1)*/
    PUNT_TO_BLTCHAR;
  }

  if (displaydata68k->ddslowprintingcase) { PUNT_TO_BLTCHAR; /** \SLOWBLTCHAR--return;**/ }

  FGetNum(displaydata68k->ddxposition, curx);
  FGetNum(displaydata68k->ddrightmargin, rmargin);
  FGetNum(displaydata68k->ddleftmargin, lmargin);
  FGetNum(displaydata68k->ddxoffset, xoff);

  right =
      curx +
      GETWORD((DLword *)NativeAligned2FromLAddr(displaydata68k->ddcharimagewidths + ((BLTARG *)args)->char8code));

  if ((right > rmargin) && (curx > lmargin)) PUNT_TO_BLTCHAR;
  if (((BLTARG *)args)->displaystream != *TOPWDS68k) PUNT_TO_BLTCHAR;

  {
    int newpos;
    newpos = curx +
             GETWORD((DLword *)NativeAligned2FromLAddr(displaydata68k->ddwidthscache + ((BLTARG *)args)->char8code));

    if ((0 <= newpos) && (newpos < 65536))
      (displaydata68k->ddxposition) = (LispPTR)(S_POSITIVE | newpos);
    else if (-65537 < newpos)
      (displaydata68k->ddxposition) = (LispPTR)(S_NEGATIVE | (0xffff & newpos));
    else {
      PUNT_TO_BLTCHAR;
    }
  }

  curx += xoff;
  right += xoff;
  if (right > (int)(displaydata68k->ddclippingright)) right = displaydata68k->ddclippingright;

  if (curx > (int)(displaydata68k->ddclippingleft))
    left = curx;
  else
    left = displaydata68k->ddclippingleft;

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(displaydata68k->ddpilotbbt);
  h = pbt->pbtheight;
  w = right - left;
  if ((h <= 0) || (w <= 0)) return;

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));

  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  op = pbt->pbtoperation;
  src_comp = pbt->pbtsourcetype;

  srcbpl = abs(pbt->pbtsourcebpl);
  dstbpl = abs(pbt->pbtdestbpl);
  base = GETWORD(NativeAligned2FromLAddr(displaydata68k->ddoffsetscache + ((BLTARG *)args)->char8code));
  sx = base + left - curx;
  dx = left;

  LOCKSCREEN;

#ifdef REALCURSOR
  displayflg = (cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (left >> 4)), (right - left),
                         pbt->pbtheight, pbt->pbtbackward));
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_char_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("newbltchar:  x %d, y 0x%x, w %d, h %d.\n", dx, dstbase, w, h));*/
      flush_display_lineregion(dx, dstbase, w, h);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */
#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* SDL */
#ifdef DOS
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;

}